

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_proxy_module.c
# Opt level: O1

ngx_int_t ngx_http_proxy_create_request(ngx_http_request_t *r)

{
  long *plVar1;
  long *plVar2;
  ngx_http_upstream_t *pnVar3;
  ngx_uint_t nVar4;
  ngx_log_t *pnVar5;
  ngx_chain_t *pnVar6;
  size_t sVar7;
  byte bVar8;
  ngx_str_t *pnVar9;
  ngx_int_t nVar10;
  uintptr_t uVar11;
  long lVar12;
  void *pvVar13;
  ngx_http_request_t *pnVar14;
  u_char *puVar15;
  ngx_hash_t *pnVar16;
  void *pvVar17;
  ngx_buf_t *pnVar18;
  ngx_http_request_t *pnVar19;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  size_t sVar20;
  long lVar21;
  ngx_list_part_t *pnVar22;
  long lVar23;
  u_char *puVar24;
  ngx_buf_t *pnVar25;
  ngx_buf_t *pnVar26;
  size_t sVar27;
  ulong uVar28;
  byte bVar29;
  ngx_hash_elt_t *local_148;
  u_char *puStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  ulong local_108;
  undefined8 uStack_100;
  ngx_http_request_t *local_f8;
  long *plStack_e8;
  ngx_http_script_engine_t le;
  ngx_str_t local_78;
  ngx_http_upstream_t *local_68;
  ngx_hash_t *local_60;
  u_char *local_58;
  ngx_hash_t *local_50;
  void *local_48;
  ngx_buf_t *local_40;
  void *local_38;
  
  bVar29 = 0;
  pnVar3 = r->upstream;
  pvVar17 = r->loc_conf[ngx_http_proxy_module.ctx_index];
  local_50 = (ngx_hash_t *)((long)pvVar17 + 0x208);
  if ((pnVar3->field_0x3e8 & 2) == 0) {
    local_50 = (ngx_hash_t *)((long)pvVar17 + 0x1e0);
  }
  if ((pnVar3->method).len == 0) {
    if (*(ngx_http_complex_value_t **)((long)pvVar17 + 0x260) == (ngx_http_complex_value_t *)0x0) {
      pnVar9 = &r->method_name;
      goto LAB_0016f5b0;
    }
    nVar10 = ngx_http_complex_value
                       (r,*(ngx_http_complex_value_t **)((long)pvVar17 + 0x260),&local_78);
    in_RDX = extraout_RDX_00;
    if (nVar10 != 0) {
      return -1;
    }
  }
  else {
    pnVar9 = &pnVar3->method;
LAB_0016f5b0:
    local_78.len = pnVar9->len;
    local_78.data = pnVar9->data;
  }
  local_38 = r->ctx[ngx_http_proxy_module.ctx_index];
  local_48 = pvVar17;
  if ((local_78.len == 4) &&
     (nVar10 = ngx_strncasecmp(local_78.data,(u_char *)"HEAD",4), in_RDX = extraout_RDX, nVar10 == 0
     )) {
    *(byte *)((long)local_38 + 0xa8) = *(byte *)((long)local_38 + 0xa8) | 1;
  }
  sVar7 = local_78.len;
  if ((*(long *)((long)local_48 + 0x238) == 0) ||
     (sVar27 = *(size_t *)((long)local_38 + 0x80), sVar27 == 0)) {
    if ((*(long *)((long)local_38 + 0x80) == 0) &&
       (((r->field_0x465 & 0x10) != 0 && (r->main == r)))) {
      sVar27 = (r->unparsed_uri).len;
      local_58 = (u_char *)0x0;
      goto LAB_0016f620;
    }
    if ((*(ulong *)&r->field_0x460 >> 0x2b & 1) == 0 || *(long *)((long)local_38 + 0x80) == 0) {
      lVar23 = 0;
    }
    else {
      lVar23 = *(long *)((long)local_48 + 0x268);
    }
    if (((*(ulong *)&r->field_0x460 & 0x14000000000) == 0) && ((r->field_0x469 & 0x40) == 0)) {
      le.request = (ngx_http_request_t *)0x0;
    }
    else {
      uVar11 = ngx_escape_uri((u_char *)0x0,(r->uri).data + lVar23,(r->uri).len - lVar23,0);
      le.request = (ngx_http_request_t *)(uVar11 * 2);
    }
    sVar27 = (long)le.request +
             (r->args).len + (r->uri).len + (*(long *)((long)local_38 + 0x80) - lVar23) + 1;
    local_58 = (u_char *)CONCAT71((int7)((ulong)local_38 >> 8),1);
  }
  else {
    local_58 = (u_char *)CONCAT71((int7)((ulong)in_RDX >> 8),1);
LAB_0016f620:
    le.request = (ngx_http_request_t *)0x0;
    lVar23 = 0;
  }
  pvVar17 = local_48;
  if (sVar27 == 0) {
    pnVar5 = r->connection->log;
    if (pnVar5->log_level < 4) {
      return -1;
    }
    ngx_log_error_core(4,pnVar5,0,"zero length URI to proxy");
    return -1;
  }
  sVar27 = sVar7 + 0xe + sVar27;
  le.args = (u_char *)0x0;
  le._64_8_ = 0;
  le.line.len = 0;
  le.line.data = (u_char *)0x0;
  le.buf.len = 0;
  le.buf.data = (u_char *)0x0;
  le.pos = (u_char *)0x0;
  le.sp = (ngx_http_variable_value_t *)0x0;
  plStack_e8 = (long *)0x0;
  le.ip = (u_char *)0x0;
  le.status = 0;
  ngx_http_script_flush_no_cacheable_variables(r,*(ngx_array_t **)((long)local_48 + 0x1b8));
  ngx_http_script_flush_no_cacheable_variables(r,(ngx_array_t *)local_50->buckets);
  if (*(undefined8 **)((long)pvVar17 + 0x1c0) == (undefined8 *)0x0) {
    if ((((r->headers_in).field_0x168 & 4) == 0) || ((r->field_0x469 & 0x20) == 0)) {
      *(off_t *)((long)local_38 + 0x90) = (r->headers_in).content_length_n;
    }
    else {
      *(undefined8 *)((long)local_38 + 0x90) = 0xffffffffffffffff;
      *(byte *)((long)local_38 + 0xa8) = *(byte *)((long)local_38 + 0xa8) | 2;
    }
  }
  else {
    plStack_e8 = (long *)**(undefined8 **)((long)pvVar17 + 0x1c0);
    le.args = (u_char *)((ulong)le.args | 1);
    if (*plStack_e8 == 0) {
      lVar21 = 0;
    }
    else {
      lVar21 = 0;
      le.status = (ngx_int_t)r;
      do {
        lVar12 = (*(code *)*plStack_e8)(&plStack_e8);
        lVar21 = lVar21 + lVar12;
      } while (*plStack_e8 != 0);
    }
    *(long *)((long)local_38 + 0x90) = lVar21;
    sVar27 = sVar27 + lVar21;
  }
  plStack_e8 = *(long **)local_50->size;
  le.args = (u_char *)((ulong)le.args | 1);
  le.status = (ngx_int_t)r;
  if (*plStack_e8 != 0) {
    do {
      while (*plStack_e8 != 0) {
        lVar21 = (*(code *)*plStack_e8)(&plStack_e8);
        sVar27 = sVar27 + lVar21;
      }
      plVar1 = plStack_e8 + 1;
      plVar2 = plStack_e8 + 1;
      plStack_e8 = plVar1;
    } while (*plVar2 != 0);
  }
  local_68 = pnVar3;
  if (*(long *)((long)local_48 + 0xb0) != 0) {
    pnVar22 = &(r->headers_in).headers.part;
    pvVar17 = (r->headers_in).headers.part.elts;
    local_60 = (ngx_hash_t *)&local_50[1].size;
    uVar28 = 0;
    do {
      if (pnVar22->nelts <= uVar28) {
        pnVar22 = pnVar22->next;
        if (pnVar22 == (ngx_list_part_t *)0x0) break;
        pvVar17 = pnVar22->elts;
        uVar28 = 0;
      }
      lVar21 = uVar28 * 0x30;
      pvVar13 = ngx_hash_find(local_60,*(ngx_uint_t *)((long)pvVar17 + lVar21),
                              *(u_char **)((long)pvVar17 + lVar21 + 0x28),
                              *(size_t *)((long)pvVar17 + lVar21 + 8));
      if (pvVar13 == (void *)0x0) {
        sVar27 = sVar27 + *(long *)((long)pvVar17 + lVar21 + 8) +
                 *(long *)((long)pvVar17 + lVar21 + 0x18) + 4;
      }
      uVar28 = uVar28 + 1;
    } while( true );
  }
  pnVar3 = local_68;
  local_40 = ngx_create_temp_buf(r->pool,sVar27);
  if (local_40 == (ngx_buf_t *)0x0) {
    return -1;
  }
  pnVar14 = (ngx_http_request_t *)ngx_alloc_chain_link(r->pool);
  pnVar18 = local_40;
  if (pnVar14 == (ngx_http_request_t *)0x0) {
    return -1;
  }
  *(ngx_buf_t **)pnVar14 = local_40;
  puVar15 = local_40->last;
  memcpy(puVar15,local_78.data,local_78.len);
  pvVar17 = local_38;
  puVar15 = puVar15 + local_78.len;
  pnVar18->last = puVar15 + 1;
  *puVar15 = ' ';
  puVar15 = pnVar18->last;
  (pnVar3->uri).data = puVar15;
  if ((*(long *)((long)local_48 + 0x238) == 0) ||
     (sVar20 = *(size_t *)((long)local_38 + 0x80), sVar20 == 0)) {
    if ((char)local_58 == '\0') {
      pnVar9 = &r->unparsed_uri;
      sVar20 = (r->unparsed_uri).len;
      puVar24 = (r->unparsed_uri).data;
      goto LAB_0016fae2;
    }
    if ((r->field_0x465 & 8) != 0) {
      memcpy(puVar15,*(void **)((long)local_38 + 0x88),*(size_t *)((long)local_38 + 0x80));
      local_40->last = puVar15 + *(long *)((long)pvVar17 + 0x80);
    }
    pnVar18 = local_40;
    puVar24 = (r->uri).data + lVar23;
    sVar20 = (r->uri).len - lVar23;
    puVar15 = local_40->last;
    if (le.request == (ngx_http_request_t *)0x0) {
      memcpy(puVar15,puVar24,sVar20);
      puVar15 = puVar15 + ((r->uri).len - lVar23);
    }
    else {
      ngx_escape_uri(puVar15,puVar24,sVar20,0);
      puVar15 = pnVar18->last + ((r->uri).len - lVar23) + (long)le.request;
    }
    pnVar18->last = puVar15;
    if ((r->args).len != 0) {
      pnVar9 = &r->args;
      pnVar18->last = puVar15 + 1;
      *puVar15 = '?';
      puVar15 = pnVar18->last;
      sVar20 = (r->args).len;
      puVar24 = (r->args).data;
      goto LAB_0016fae2;
    }
  }
  else {
    pnVar9 = (ngx_str_t *)((long)local_38 + 0x80);
    puVar24 = *(u_char **)((long)local_38 + 0x88);
LAB_0016fae2:
    memcpy(puVar15,puVar24,sVar20);
    local_40->last = puVar15 + pnVar9->len;
    pnVar18 = local_40;
  }
  pvVar17 = local_48;
  puVar15 = pnVar18->last;
  (pnVar3->uri).len = (long)puVar15 - (long)(pnVar3->uri).data;
  if (*(long *)((long)local_48 + 0x308) == 0x3e9) {
    builtin_memcpy(puVar15," HTTP/1.1\r\n",0xb);
  }
  else {
    builtin_memcpy(puVar15," HTTP/1.0\r\n",0xb);
  }
  local_40->last = puVar15 + 0xb;
  uStack_100 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = *local_50[1].buckets;
  puStack_140 = local_40->last;
  local_108 = 1;
  plStack_e8 = *(long **)local_50->size;
  local_f8 = r;
  if (*plStack_e8 != 0) {
    do {
      (*(code *)*plStack_e8)(&plStack_e8);
      if (*plStack_e8 == 0) {
        bVar8 = (byte)local_108 & 0xfd;
      }
      else {
        if (*plStack_e8 == 0) {
          bVar8 = 0;
        }
        else {
          lVar23 = 0;
          do {
            lVar21 = (*(code *)*plStack_e8)(&plStack_e8);
            lVar23 = lVar23 + lVar21;
          } while (*plStack_e8 != 0);
          bVar8 = (lVar23 == 2) * '\x02';
        }
        bVar8 = (byte)local_108 & 0xfd | bVar8;
      }
      plStack_e8 = plStack_e8 + 1;
      local_108 = CONCAT71(local_108._1_7_,bVar8);
      while (local_148->value != (void *)0x0) {
        (*(code *)local_148->value)(&local_148);
      }
      local_148 = (ngx_hash_elt_t *)&local_148->len;
    } while (*plStack_e8 != 0);
  }
  local_40->last = puStack_140;
  if (*(long *)((long)pvVar17 + 0xb0) != 0) {
    pnVar22 = &(r->headers_in).headers.part;
    local_50 = (ngx_hash_t *)&local_50[1].size;
    uVar28 = 0;
    pnVar16 = (ngx_hash_t *)(r->headers_in).headers.part.elts;
    do {
      if (pnVar22->nelts <= uVar28) {
        pnVar22 = pnVar22->next;
        if (pnVar22 == (ngx_list_part_t *)0x0) break;
        pnVar16 = (ngx_hash_t *)pnVar22->elts;
        uVar28 = 0;
      }
      local_60 = pnVar16;
      pvVar17 = ngx_hash_find(local_50,(ngx_uint_t)pnVar16[uVar28 * 3].buckets,
                              (u_char *)pnVar16[uVar28 * 3 + 2].size,pnVar16[uVar28 * 3].size);
      pnVar18 = local_40;
      pnVar16 = local_60;
      if (pvVar17 == (void *)0x0) {
        local_58 = local_40->last;
        memcpy(local_58,local_60[uVar28 * 3 + 1].buckets,local_60[uVar28 * 3].size);
        nVar4 = pnVar16[uVar28 * 3].size;
        pnVar18->last = local_58 + nVar4 + 1;
        local_58[nVar4] = ':';
        puVar15 = pnVar18->last;
        pnVar18->last = puVar15 + 1;
        *puVar15 = ' ';
        local_58 = pnVar18->last;
        memcpy(local_58,pnVar16[uVar28 * 3 + 2].buckets,pnVar16[uVar28 * 3 + 1].size);
        nVar4 = pnVar16[uVar28 * 3 + 1].size;
        pnVar18->last = local_58 + nVar4 + 1;
        local_58[nVar4] = '\r';
        puVar15 = pnVar18->last;
        pnVar18->last = puVar15 + 1;
        *puVar15 = '\n';
        pnVar5 = r->connection->log;
        if ((pnVar5->log_level & 0x100) != 0) {
          ngx_log_error_core(8,pnVar5,0,"http proxy header: \"%V: %V\"",&local_60[uVar28 * 3].size,
                             &pnVar16[uVar28 * 3 + 1].size);
        }
      }
      uVar28 = uVar28 + 1;
      pnVar16 = local_60;
    } while( true );
  }
  pvVar17 = local_48;
  puVar15 = local_40->last;
  local_40->last = puVar15 + 1;
  *puVar15 = '\r';
  puVar15 = local_40->last;
  local_40->last = puVar15 + 1;
  *puVar15 = '\n';
  if (*(long **)((long)local_48 + 0x1c8) != (long *)0x0) {
    local_148 = (ngx_hash_elt_t *)**(long **)((long)local_48 + 0x1c8);
    puStack_140 = local_40->last;
    local_108 = local_108 & 0xfffffffffffffffd;
    if (local_148->value != (void *)0x0) {
      do {
        (*(code *)local_148->value)(&local_148);
      } while (local_148->value != (void *)0x0);
    }
    local_40->last = puStack_140;
  }
  pnVar5 = r->connection->log;
  if ((pnVar5->log_level & 0x100) != 0) {
    ngx_log_error_core(8,pnVar5,0,"http proxy header:%N\"%*s\"",
                       (long)local_40->last - (long)local_40->pos);
  }
  if ((r->field_0x467 & 4) == 0) {
    lVar23 = 0x88;
    pnVar19 = pnVar14;
    if ((*(long *)((long)pvVar17 + 0x1c8) == 0) && (*(long *)((long)pvVar17 + 0xb8) != 0)) {
      pnVar6 = local_68->request_bufs;
      local_68->request_bufs = (ngx_chain_t *)pnVar14;
      for (; pnVar6 != (ngx_chain_t *)0x0; pnVar6 = pnVar6->next) {
        pnVar18 = (ngx_buf_t *)ngx_palloc(r->pool,0x50);
        if (pnVar18 == (ngx_buf_t *)0x0) {
          return -1;
        }
        pnVar25 = pnVar6->buf;
        pnVar26 = pnVar18;
        for (lVar23 = 10; lVar23 != 0; lVar23 = lVar23 + -1) {
          pnVar26->pos = pnVar25->pos;
          pnVar25 = (ngx_buf_t *)((long)pnVar25 + ((ulong)bVar29 * -2 + 1) * 8);
          pnVar26 = (ngx_buf_t *)((long)pnVar26 + (ulong)bVar29 * -0x10 + 8);
        }
        pnVar19 = (ngx_http_request_t *)ngx_alloc_chain_link(r->pool);
        pnVar14->connection = (ngx_connection_t *)pnVar19;
        if (pnVar19 == (ngx_http_request_t *)0x0) {
          return -1;
        }
        *(ngx_buf_t **)pnVar19 = pnVar18;
        pnVar14 = pnVar19;
        local_40 = pnVar18;
      }
      goto LAB_0016ff2b;
    }
  }
  else {
    local_68->request_bufs = (ngx_chain_t *)pnVar14;
    if ((*(byte *)((long)local_38 + 0xa8) & 2) == 0) goto LAB_0016ff2b;
    (local_68->output).output_filter = ngx_http_proxy_body_output_filter;
    lVar23 = 0xf0;
    pnVar19 = r;
  }
  *(ngx_http_request_t **)((long)&local_68->read_event_handler + lVar23) = pnVar19;
LAB_0016ff2b:
  local_40->field_0x48 = local_40->field_0x48 | 0x20;
  pnVar14->connection = (ngx_connection_t *)0x0;
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_proxy_create_request(ngx_http_request_t *r)
{
    size_t                        len, uri_len, loc_len, body_len;
    uintptr_t                     escape;
    ngx_buf_t                    *b;
    ngx_str_t                     method;
    ngx_uint_t                    i, unparsed_uri;
    ngx_chain_t                  *cl, *body;
    ngx_list_part_t              *part;
    ngx_table_elt_t              *header;
    ngx_http_upstream_t          *u;
    ngx_http_proxy_ctx_t         *ctx;
    ngx_http_script_code_pt       code;
    ngx_http_proxy_headers_t     *headers;
    ngx_http_script_engine_t      e, le;
    ngx_http_proxy_loc_conf_t    *plcf;
    ngx_http_script_len_code_pt   lcode;

    u = r->upstream;

    plcf = ngx_http_get_module_loc_conf(r, ngx_http_proxy_module);

#if (NGX_HTTP_CACHE)
    headers = u->cacheable ? &plcf->headers_cache : &plcf->headers;
#else
    headers = &plcf->headers;
#endif

    if (u->method.len) {
        /* HEAD was changed to GET to cache response */
        method = u->method;

    } else if (plcf->method) {
        if (ngx_http_complex_value(r, plcf->method, &method) != NGX_OK) {
            return NGX_ERROR;
        }

    } else {
        method = r->method_name;
    }

    ctx = ngx_http_get_module_ctx(r, ngx_http_proxy_module);

    if (method.len == 4
        && ngx_strncasecmp(method.data, (u_char *) "HEAD", 4) == 0)
    {
        ctx->head = 1;
    }

    len = method.len + 1 + sizeof(ngx_http_proxy_version) - 1
          + sizeof(CRLF) - 1;

    escape = 0;
    loc_len = 0;
    unparsed_uri = 0;

    if (plcf->proxy_lengths && ctx->vars.uri.len) {
        uri_len = ctx->vars.uri.len;

    } else if (ctx->vars.uri.len == 0 && r->valid_unparsed_uri && r == r->main)
    {
        unparsed_uri = 1;
        uri_len = r->unparsed_uri.len;

    } else {
        loc_len = (r->valid_location && ctx->vars.uri.len) ?
                      plcf->location.len : 0;

        if (r->quoted_uri || r->space_in_uri || r->internal) {
            escape = 2 * ngx_escape_uri(NULL, r->uri.data + loc_len,
                                        r->uri.len - loc_len, NGX_ESCAPE_URI);
        }

        uri_len = ctx->vars.uri.len + r->uri.len - loc_len + escape
                  + sizeof("?") - 1 + r->args.len;
    }

    if (uri_len == 0) {
        ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                      "zero length URI to proxy");
        return NGX_ERROR;
    }

    len += uri_len;

    ngx_memzero(&le, sizeof(ngx_http_script_engine_t));

    ngx_http_script_flush_no_cacheable_variables(r, plcf->body_flushes);
    ngx_http_script_flush_no_cacheable_variables(r, headers->flushes);

    if (plcf->body_lengths) {
        le.ip = plcf->body_lengths->elts;
        le.request = r;
        le.flushed = 1;
        body_len = 0;

        while (*(uintptr_t *) le.ip) {
            lcode = *(ngx_http_script_len_code_pt *) le.ip;
            body_len += lcode(&le);
        }

        ctx->internal_body_length = body_len;
        len += body_len;

    } else if (r->headers_in.chunked && r->reading_body) {
        ctx->internal_body_length = -1;
        ctx->internal_chunked = 1;

    } else {
        ctx->internal_body_length = r->headers_in.content_length_n;
    }

    le.ip = headers->lengths->elts;
    le.request = r;
    le.flushed = 1;

    while (*(uintptr_t *) le.ip) {
        while (*(uintptr_t *) le.ip) {
            lcode = *(ngx_http_script_len_code_pt *) le.ip;
            len += lcode(&le);
        }
        le.ip += sizeof(uintptr_t);
    }


    if (plcf->upstream.pass_request_headers) {
        part = &r->headers_in.headers.part;
        header = part->elts;

        for (i = 0; /* void */; i++) {

            if (i >= part->nelts) {
                if (part->next == NULL) {
                    break;
                }

                part = part->next;
                header = part->elts;
                i = 0;
            }

            if (ngx_hash_find(&headers->hash, header[i].hash,
                              header[i].lowcase_key, header[i].key.len))
            {
                continue;
            }

            len += header[i].key.len + sizeof(": ") - 1
                + header[i].value.len + sizeof(CRLF) - 1;
        }
    }


    b = ngx_create_temp_buf(r->pool, len);
    if (b == NULL) {
        return NGX_ERROR;
    }

    cl = ngx_alloc_chain_link(r->pool);
    if (cl == NULL) {
        return NGX_ERROR;
    }

    cl->buf = b;


    /* the request line */

    b->last = ngx_copy(b->last, method.data, method.len);
    *b->last++ = ' ';

    u->uri.data = b->last;

    if (plcf->proxy_lengths && ctx->vars.uri.len) {
        b->last = ngx_copy(b->last, ctx->vars.uri.data, ctx->vars.uri.len);

    } else if (unparsed_uri) {
        b->last = ngx_copy(b->last, r->unparsed_uri.data, r->unparsed_uri.len);

    } else {
        if (r->valid_location) {
            b->last = ngx_copy(b->last, ctx->vars.uri.data, ctx->vars.uri.len);
        }

        if (escape) {
            ngx_escape_uri(b->last, r->uri.data + loc_len,
                           r->uri.len - loc_len, NGX_ESCAPE_URI);
            b->last += r->uri.len - loc_len + escape;

        } else {
            b->last = ngx_copy(b->last, r->uri.data + loc_len,
                               r->uri.len - loc_len);
        }

        if (r->args.len > 0) {
            *b->last++ = '?';
            b->last = ngx_copy(b->last, r->args.data, r->args.len);
        }
    }

    u->uri.len = b->last - u->uri.data;

    if (plcf->http_version == NGX_HTTP_VERSION_11) {
        b->last = ngx_cpymem(b->last, ngx_http_proxy_version_11,
                             sizeof(ngx_http_proxy_version_11) - 1);

    } else {
        b->last = ngx_cpymem(b->last, ngx_http_proxy_version,
                             sizeof(ngx_http_proxy_version) - 1);
    }

    ngx_memzero(&e, sizeof(ngx_http_script_engine_t));

    e.ip = headers->values->elts;
    e.pos = b->last;
    e.request = r;
    e.flushed = 1;

    le.ip = headers->lengths->elts;

    while (*(uintptr_t *) le.ip) {
        lcode = *(ngx_http_script_len_code_pt *) le.ip;

        /* skip the header line name length */
        (void) lcode(&le);

        if (*(ngx_http_script_len_code_pt *) le.ip) {

            for (len = 0; *(uintptr_t *) le.ip; len += lcode(&le)) {
                lcode = *(ngx_http_script_len_code_pt *) le.ip;
            }

            e.skip = (len == sizeof(CRLF) - 1) ? 1 : 0;

        } else {
            e.skip = 0;
        }

        le.ip += sizeof(uintptr_t);

        while (*(uintptr_t *) e.ip) {
            code = *(ngx_http_script_code_pt *) e.ip;
            code((ngx_http_script_engine_t *) &e);
        }
        e.ip += sizeof(uintptr_t);
    }

    b->last = e.pos;


    if (plcf->upstream.pass_request_headers) {
        part = &r->headers_in.headers.part;
        header = part->elts;

        for (i = 0; /* void */; i++) {

            if (i >= part->nelts) {
                if (part->next == NULL) {
                    break;
                }

                part = part->next;
                header = part->elts;
                i = 0;
            }

            if (ngx_hash_find(&headers->hash, header[i].hash,
                              header[i].lowcase_key, header[i].key.len))
            {
                continue;
            }

            b->last = ngx_copy(b->last, header[i].key.data, header[i].key.len);

            *b->last++ = ':'; *b->last++ = ' ';

            b->last = ngx_copy(b->last, header[i].value.data,
                               header[i].value.len);

            *b->last++ = CR; *b->last++ = LF;

            ngx_log_debug2(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                           "http proxy header: \"%V: %V\"",
                           &header[i].key, &header[i].value);
        }
    }


    /* add "\r\n" at the header end */
    *b->last++ = CR; *b->last++ = LF;

    if (plcf->body_values) {
        e.ip = plcf->body_values->elts;
        e.pos = b->last;
        e.skip = 0;

        while (*(uintptr_t *) e.ip) {
            code = *(ngx_http_script_code_pt *) e.ip;
            code((ngx_http_script_engine_t *) &e);
        }

        b->last = e.pos;
    }

    ngx_log_debug2(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "http proxy header:%N\"%*s\"",
                   (size_t) (b->last - b->pos), b->pos);

    if (r->request_body_no_buffering) {

        u->request_bufs = cl;

        if (ctx->internal_chunked) {
            u->output.output_filter = ngx_http_proxy_body_output_filter;
            u->output.filter_ctx = r;
        }

    } else if (plcf->body_values == NULL && plcf->upstream.pass_request_body) {

        body = u->request_bufs;
        u->request_bufs = cl;

        while (body) {
            b = ngx_alloc_buf(r->pool);
            if (b == NULL) {
                return NGX_ERROR;
            }

            ngx_memcpy(b, body->buf, sizeof(ngx_buf_t));

            cl->next = ngx_alloc_chain_link(r->pool);
            if (cl->next == NULL) {
                return NGX_ERROR;
            }

            cl = cl->next;
            cl->buf = b;

            body = body->next;
        }

    } else {
        u->request_bufs = cl;
    }

    b->flush = 1;
    cl->next = NULL;

    return NGX_OK;
}